

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O2

t_pool_result * t_pool_next_result_wait(t_results_queue *q)

{
  pthread_mutex_t *__mutex;
  t_pool_result *ptVar1;
  timespec timeout;
  timeval now;
  timespec local_50;
  timeval local_40;
  
  __mutex = &q->result_m;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  while( true ) {
    ptVar1 = t_pool_next_result_locked(q);
    if (ptVar1 != (t_pool_result *)0x0) break;
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    local_50.tv_sec = local_40.tv_sec + 10;
    local_50.tv_nsec = local_40.tv_usec * 1000;
    pthread_cond_timedwait
              ((pthread_cond_t *)&q->result_avail_c,(pthread_mutex_t *)__mutex,&local_50);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return ptVar1;
}

Assistant:

t_pool_result *t_pool_next_result_wait(t_results_queue *q) {
    t_pool_result *r;

#ifdef DEBUG
    fprintf(stderr, "Waiting for result %d...\n", q->next_serial);
#endif

    pthread_mutex_lock(&q->result_m);
    while (!(r = t_pool_next_result_locked(q))) {
	/* Possible race here now avoided via _locked() call, but incase... */
	struct timeval now;
	struct timespec timeout;

	gettimeofday(&now, NULL);
	timeout.tv_sec = now.tv_sec + 10;
	timeout.tv_nsec = now.tv_usec * 1000;

	pthread_cond_timedwait(&q->result_avail_c, &q->result_m, &timeout);
    }
    pthread_mutex_unlock(&q->result_m);

    return r;
}